

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::computeTypeUniformLocationSize(TType *type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this;
  size_type sVar5;
  undefined1 local_158 [8];
  TType memberType;
  int local_b8;
  int member;
  int size;
  TType elementType;
  TType *type_local;
  
  elementType.spirvType = (TSpirvType *)type;
  uVar1 = (*type->_vptr_TType[0x1d])();
  if ((uVar1 & 1) == 0) {
    uVar4 = (*(code *)((elementType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                      allocator[3].alignment)();
    if ((uVar4 & 1) == 0) {
      type_local._4_4_ = 1;
    }
    else {
      local_b8 = 0;
      memberType.spirvType._4_4_ = 0;
      while( true ) {
        iVar3 = memberType.spirvType._4_4_;
        this = &TType::getStruct((TType *)elementType.spirvType)->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this);
        if ((int)sVar5 <= iVar3) break;
        TType::TType((TType *)local_158,(TType *)elementType.spirvType,memberType.spirvType._4_4_,
                     false);
        iVar3 = computeTypeUniformLocationSize((TType *)local_158);
        local_b8 = iVar3 + local_b8;
        TType::~TType((TType *)local_158);
        memberType.spirvType._4_4_ = memberType.spirvType._4_4_ + 1;
      }
      type_local._4_4_ = local_b8;
    }
  }
  else {
    TType::TType((TType *)&size,(TType *)elementType.spirvType,0,false);
    uVar4 = (*(code *)((elementType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                      allocator[2].inUseList)();
    if ((uVar4 & 1) == 0) {
      type_local._4_4_ = computeTypeUniformLocationSize((TType *)&size);
    }
    else {
      iVar3 = (*(code *)((elementType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[1].headerSkip)();
      iVar2 = computeTypeUniformLocationSize((TType *)&size);
      type_local._4_4_ = iVar3 * iVar2;
    }
    TType::~TType((TType *)&size);
  }
  return type_local._4_4_;
}

Assistant:

int TIntermediate::computeTypeUniformLocationSize(const TType& type)
{
    // "Individual elements of a uniform array are assigned
    // consecutive locations with the first element taking location
    // location."
    if (type.isArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        TType elementType(type, 0);
        if (type.isSizedArray()) {
            return type.getOuterArraySize() * computeTypeUniformLocationSize(elementType);
        } else {
            // TODO: are there valid cases of having an implicitly-sized array with a location?  If so, running this code too early.
            return computeTypeUniformLocationSize(elementType);
        }
    }

    // "Each subsequent inner-most member or element gets incremental
    // locations for the entire structure or array."
    if (type.isStruct()) {
        int size = 0;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            size += computeTypeUniformLocationSize(memberType);
        }
        return size;
    }

    return 1;
}